

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O0

string * __thiscall adios2::kvcache::QueryBox::toString_abi_cxx11_(QueryBox *this)

{
  ulong uVar1;
  size_t sVar2;
  CoreDims *in_RSI;
  string *in_RDI;
  size_t i_1;
  size_t i;
  string *str;
  string *this_00;
  string local_78 [32];
  ulong local_58;
  string local_50 [32];
  ulong local_30;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"Start_",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  for (local_30 = 0; uVar1 = local_30, sVar2 = helper::CoreDims::size(in_RSI), uVar1 < sVar2;
      local_30 = local_30 + 1) {
    helper::CoreDims::operator[](in_RSI,local_30);
    std::__cxx11::to_string((unsigned_long)this_00);
    std::__cxx11::string::operator+=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    uVar1 = local_30;
    sVar2 = helper::CoreDims::size(in_RSI);
    if (uVar1 != sVar2 - 1) {
      std::__cxx11::string::operator+=((string *)this_00,"_");
    }
  }
  std::__cxx11::string::operator+=((string *)this_00,"|Count_");
  for (local_58 = 0; uVar1 = local_58, sVar2 = helper::CoreDims::size(in_RSI), uVar1 < sVar2;
      local_58 = local_58 + 1) {
    helper::CoreDims::operator[](in_RSI + 0x11,local_58);
    std::__cxx11::to_string((unsigned_long)this_00);
    std::__cxx11::string::operator+=((string *)this_00,local_78);
    std::__cxx11::string::~string(local_78);
    uVar1 = local_58;
    sVar2 = helper::CoreDims::size(in_RSI);
    if (uVar1 != sVar2 - 1) {
      std::__cxx11::string::operator+=((string *)this_00,"_");
    }
  }
  std::__cxx11::string::operator+=((string *)this_00,"|");
  return in_RDI;
}

Assistant:

std::string toString() const
    {
        std::string str = "Start_";
        for (size_t i = 0; i < Start.size(); ++i)
        {
            str += std::to_string(Start[i]);
            if (i != Start.size() - 1)
            {
                str += "_";
            }
        }
        str += "|Count_";
        for (size_t i = 0; i < Start.size(); ++i)
        {
            str += std::to_string(Count[i]);
            if (i != Start.size() - 1)
            {
                str += "_";
            }
        }
        str += "|";
        return str;
    }